

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void ncnn::cast_float16_to_float32(Mat *src,Mat *dst,Allocator *allocator,int num_threads)

{
  Layer *pLVar1;
  Option opt;
  ParamDict pd;
  
  pLVar1 = create_layer(0x40);
  ParamDict::ParamDict(&pd);
  ParamDict::set(&pd,0,2);
  ParamDict::set(&pd,1,1);
  (*pLVar1->_vptr_Layer[2])(pLVar1,&pd);
  get_default_option();
  (*pLVar1->_vptr_Layer[7])(pLVar1,src,dst);
  (*pLVar1->_vptr_Layer[1])(pLVar1);
  ParamDict::~ParamDict(&pd);
  return;
}

Assistant:

void cast_float16_to_float32(const Mat& src, Mat& dst, Allocator* allocator, int num_threads)
{
    ncnn::Layer* cast = ncnn::create_layer(ncnn::LayerType::Cast);

    ncnn::ParamDict pd;
    pd.set(0, 2);
    pd.set(1, 1);

    cast->load_param(pd);

    ncnn::Option opt = ncnn::get_default_option();
    opt.num_threads = num_threads;
    opt.blob_allocator = allocator;

    cast->forward(src, dst, opt);

    delete cast;
}